

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O0

int __thiscall ncnn::Convolution::load_model(Convolution *this,ModelBin *mb)

{
  bool bVar1;
  long *in_RSI;
  long in_RDI;
  Mat *in_stack_fffffffffffffe40;
  Mat *m;
  Mat *in_stack_fffffffffffffe48;
  Mat local_190;
  Mat local_148;
  undefined1 local_100 [72];
  undefined1 local_b8 [88];
  undefined1 local_60 [72];
  long *local_18;
  int local_4;
  
  if (*(int *)(in_RDI + 0x158) == 0) {
    local_18 = in_RSI;
    (**(code **)(*in_RSI + 0x10))(local_60,in_RSI,*(undefined4 *)(in_RDI + 0x104),0);
    Mat::operator=(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    Mat::~Mat((Mat *)0x18357d);
    bVar1 = Mat::empty(in_stack_fffffffffffffe40);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      if (*(int *)(in_RDI + 0x100) != 0) {
        (**(code **)(*local_18 + 0x10))(local_b8,local_18,*(undefined4 *)(in_RDI + 0xd0),1);
        Mat::operator=(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
        Mat::~Mat((Mat *)0x18362f);
        bVar1 = Mat::empty(in_stack_fffffffffffffe40);
        if (bVar1) {
          return -100;
        }
      }
      if (*(int *)(in_RDI + 0x108) != 0) {
        (**(code **)(*local_18 + 0x10))(local_100,local_18,*(undefined4 *)(in_RDI + 0xd0),1);
        Mat::operator=(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
        Mat::~Mat((Mat *)0x1836e3);
        in_stack_fffffffffffffe48 = &local_148;
        (**(code **)(*local_18 + 0x10))(in_stack_fffffffffffffe48,local_18,1);
        Mat::operator=(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
        Mat::~Mat((Mat *)0x18372d);
      }
      if (100 < *(int *)(in_RDI + 0x108)) {
        m = &local_190;
        (**(code **)(*local_18 + 0x10))(m,local_18,1);
        Mat::operator=(in_stack_fffffffffffffe48,m);
        Mat::~Mat((Mat *)0x1837cd);
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Convolution::load_model(const ModelBin& mb)
{
    if (dynamic_weight)
        return 0;

    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

#if NCNN_INT8
    if (int8_scale_term)
    {
        weight_data_int8_scales = mb.load(num_output, 1);
        bottom_blob_int8_scales = mb.load(1, 1);
    }

    if (int8_scale_term > 100)
    {
        top_blob_int8_scales = mb.load(1, 1);
    }
#endif // NCNN_INT8

    return 0;
}